

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O0

void __thiscall
MissingDependencyPrinter::OnMissingDep
          (MissingDependencyPrinter *this,Node *node,string *path,Rule *generator)

{
  ostream *poVar1;
  string *psVar2;
  Rule *generator_local;
  string *path_local;
  Node *node_local;
  MissingDependencyPrinter *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Missing dep: ");
  psVar2 = Node::path_abi_cxx11_(node);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1," uses ");
  poVar1 = std::operator<<(poVar1,(string *)path);
  poVar1 = std::operator<<(poVar1," (generated by ");
  psVar2 = Rule::name_abi_cxx11_(generator);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,")\n");
  return;
}

Assistant:

void MissingDependencyPrinter::OnMissingDep(Node* node, const std::string& path,
                                            const Rule& generator) {
  std::cout << "Missing dep: " << node->path() << " uses " << path
            << " (generated by " << generator.name() << ")\n";
}